

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O3

void __thiscall NPC::Spawn(NPC *this,NPC *parent)

{
  short sVar1;
  pointer ppNVar2;
  NPC *this_00;
  Character *this_01;
  bool bVar3;
  int iVar4;
  NPC_Data *pNVar5;
  ENF_Data *pEVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  pointer ppNVar12;
  list<Character_*,_std::allocator<Character_*>_> *plVar13;
  _List_node_base *p_Var14;
  double dVar15;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  if (this->alive != false) {
    return;
  }
  pNVar5 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar6 = NPC_Data::ENF(pNVar5);
  if ((parent == (NPC *)0x0) && (pEVar6->boss != 0)) {
    ppNVar12 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar2 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar12 == ppNVar2) goto LAB_001791b6;
    do {
      this_00 = *ppNVar12;
      pNVar5 = World::GetNpcData(this_00->map->world,(short)this_00->id);
      pEVar6 = NPC_Data::ENF(pNVar5);
      if (pEVar6->child != 0) {
        Spawn(this_00,this);
      }
      ppNVar12 = ppNVar12 + 1;
    } while (ppNVar12 != ppNVar2);
  }
  if (parent != (NPC *)0x0) {
    this->parent = parent;
  }
LAB_001791b6:
  if (this->spawn_type < 7) {
    uVar9 = 0;
    do {
      if ((uVar9 == 0) && (this->temporary != false)) {
        this->x = this->spawn_x;
        this->y = this->spawn_y;
        bVar3 = Map::Walkable(this->map,this->spawn_x,this->spawn_y,true);
        if (bVar3) {
LAB_00179232:
          bVar3 = Map::Occupied(this->map,this->x,this->y,NPCOnly,false);
          if (!bVar3) goto LAB_001792c4;
        }
      }
      else {
        iVar4 = util::rand();
        this->x = (uchar)iVar4;
        iVar4 = util::rand();
        this->y = (uchar)iVar4;
        bVar3 = Map::Walkable(this->map,this->x,(uchar)iVar4,true);
        if (bVar3) {
          if (uVar9 < 0x65) goto LAB_00179232;
LAB_001792c4:
          iVar4 = util::rand();
          this->direction = (Direction)iVar4;
          goto LAB_00179358;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 200);
    sVar1 = this->map->id;
    bVar10 = this->spawn_x;
    bVar7 = this->spawn_y;
    pEVar6 = ::ENF::Get(this->map->world->enf,this->id);
    Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)",
                 (ulong)(uint)(int)sVar1,(ulong)bVar10,(ulong)bVar7,(pEVar6->name)._M_dataplus._M_p)
    ;
    bVar10 = this->spawn_x;
    uVar9 = (uint)bVar10;
    bVar7 = bVar10 - 2;
    this->x = bVar7;
    if ((uint)bVar7 <= bVar10 + 2) {
      uVar8 = (uint)this->spawn_y;
      do {
        uVar11 = uVar8 - 2;
        this->y = (uchar)uVar11;
        if ((uVar11 & 0xff) <= uVar8 + 2) {
          do {
            bVar3 = Map::Walkable(this->map,this->x,(uchar)uVar11,true);
            if (bVar3) {
              Console::Wrn("Placed at valid location: %i,%i",(ulong)this->x,(ulong)this->y);
              goto LAB_00179358;
            }
            bVar10 = this->y + 1;
            uVar11 = (uint)bVar10;
            this->y = bVar10;
            uVar8 = (uint)this->spawn_y;
          } while ((uint)bVar10 <= this->spawn_y + 2);
          bVar7 = this->x;
          uVar9 = (uint)this->spawn_x;
        }
        bVar7 = bVar7 + 1;
        this->x = bVar7;
      } while ((uint)bVar7 <= uVar9 + 2);
    }
    Console::Err("NPC couldn\'t spawn anywhere valid!");
  }
LAB_00179358:
  this->alive = true;
  pNVar5 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar6 = NPC_Data::ENF(pNVar5);
  this->hp = pEVar6->hp;
  dVar15 = Timer::GetTime();
  this->last_act = dVar15;
  this->act_speed = speed_table[this->spawn_type];
  PacketBuilder::PacketBuilder(&local_60,PACKET_RANGE,PACKET_REPLY,8);
  PacketBuilder::AddChar(&local_60,0);
  PacketBuilder::AddByte(&local_60,0xff);
  PacketBuilder::AddChar(&local_60,(uint)this->index);
  PacketBuilder::AddShort(&local_60,this->id);
  PacketBuilder::AddChar(&local_60,(uint)this->x);
  PacketBuilder::AddChar(&local_60,(uint)this->y);
  PacketBuilder::AddChar(&local_60,(uint)this->direction);
  p_Var14 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  plVar13 = &this->map->characters;
  if (p_Var14 != (_List_node_base *)plVar13) {
    do {
      this_01 = (Character *)p_Var14[1]._M_next;
      bVar3 = Character::InRange(this_01,this);
      if (bVar3) {
        Character::Send(this_01,&local_60);
      }
      p_Var14 = p_Var14->_M_next;
    } while (p_Var14 != (_List_node_base *)plVar13);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void NPC::Spawn(NPC *parent)
{
	if (this->alive)
		return;

	if (this->ENF().boss && !parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().child)
			{
				npc->Spawn(this);
			}
		}
	}

	if (parent)
	{
		this->parent = parent;
	}

	if (this->spawn_type < 7)
	{
		bool found = false;
		for (int i = 0; i < 200; ++i)
		{
			if (this->temporary && i == 0)
			{
				this->x = this->spawn_x;
				this->y = this->spawn_y;
			}
			else
			{
				this->x = util::rand(this->spawn_x-2, this->spawn_x+2);
				this->y = util::rand(this->spawn_y-2, this->spawn_y+2);
			}

			if (this->map->Walkable(this->x, this->y, true) && (i > 100 || !this->map->Occupied(this->x, this->y, Map::NPCOnly)))
			{
				this->direction = static_cast<Direction>(util::rand(0,3));
				found = true;
				break;
			}
		}

		if (!found)
		{
			Console::Wrn("An NPC on map %i at %i,%i is being placed by linear scan of spawn area (%s)", this->map->id, this->spawn_x, this->spawn_y, this->map->world->enf->Get(this->id).name.c_str());
			for (this->x = this->spawn_x-2; this->x <= spawn_x+2; ++this->x)
			{
				for (this->y = this->spawn_y-2; this->y <= this->spawn_y+2; ++this->y)
				{
					if (this->map->Walkable(this->x, this->y, true))
					{
						Console::Wrn("Placed at valid location: %i,%i", this->x, this->y);
						found = true;
						goto end_linear_scan;
					}
				}
			}
		}
		end_linear_scan:

		if (!found)
		{
			Console::Err("NPC couldn't spawn anywhere valid!");
		}
	}

	this->alive = true;
	this->hp = this->ENF().hp;
	this->last_act = Timer::GetTime();
	this->act_speed = speed_table[this->spawn_type];

	PacketBuilder builder(PACKET_RANGE, PACKET_REPLY, 8);
	builder.AddChar(0);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddShort(this->id);
	builder.AddChar(this->x);
	builder.AddChar(this->y);
	builder.AddChar(this->direction);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character->InRange(this))
		{
			character->Send(builder);
		}
	}
}